

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall testing::internal::GTestFlagSaver::~GTestFlagSaver(GTestFlagSaver *this)

{
  GTestFlagSaver *this_local;
  
  FLAGS_gtest_also_run_disabled_tests = this->also_run_disabled_tests_ & 1;
  FLAGS_gtest_break_on_failure = this->break_on_failure_ & 1;
  FLAGS_gtest_catch_exceptions = this->catch_exceptions_ & 1;
  std::__cxx11::string::operator=((string *)FLAGS_gtest_color_abi_cxx11_,(string *)&this->color_);
  std::__cxx11::string::operator=
            ((string *)FLAGS_gtest_death_test_style_abi_cxx11_,(string *)&this->death_test_style_);
  FLAGS_gtest_death_test_use_fork = this->death_test_use_fork_ & 1;
  std::__cxx11::string::operator=((string *)FLAGS_gtest_filter_abi_cxx11_,(string *)&this->filter_);
  FLAGS_gtest_fail_fast = this->fail_fast_ & 1;
  std::__cxx11::string::operator=
            ((string *)FLAGS_gtest_internal_run_death_test_abi_cxx11_,
             (string *)&this->internal_run_death_test_);
  FLAGS_gtest_list_tests = this->list_tests_ & 1;
  std::__cxx11::string::operator=((string *)FLAGS_gtest_output_abi_cxx11_,(string *)&this->output_);
  FLAGS_gtest_brief = this->brief_ & 1;
  FLAGS_gtest_print_time = this->print_time_ & 1;
  FLAGS_gtest_print_utf8 = this->print_utf8_ & 1;
  FLAGS_gtest_random_seed = this->random_seed_;
  FLAGS_gtest_repeat = this->repeat_;
  FLAGS_gtest_recreate_environments_when_repeating = this->recreate_environments_when_repeating_ & 1
  ;
  FLAGS_gtest_shuffle = this->shuffle_ & 1;
  FLAGS_gtest_stack_trace_depth = this->stack_trace_depth_;
  std::__cxx11::string::operator=
            ((string *)FLAGS_gtest_stream_result_to_abi_cxx11_,(string *)&this->stream_result_to_);
  FLAGS_gtest_throw_on_failure = this->throw_on_failure_ & 1;
  std::__cxx11::string::~string((string *)&this->stream_result_to_);
  std::__cxx11::string::~string((string *)&this->output_);
  std::__cxx11::string::~string((string *)&this->internal_run_death_test_);
  std::__cxx11::string::~string((string *)&this->filter_);
  std::__cxx11::string::~string((string *)&this->death_test_style_);
  std::__cxx11::string::~string((string *)&this->color_);
  return;
}

Assistant:

~GTestFlagSaver() {
    GTEST_FLAG_SET(also_run_disabled_tests, also_run_disabled_tests_);
    GTEST_FLAG_SET(break_on_failure, break_on_failure_);
    GTEST_FLAG_SET(catch_exceptions, catch_exceptions_);
    GTEST_FLAG_SET(color, color_);
    GTEST_FLAG_SET(death_test_style, death_test_style_);
    GTEST_FLAG_SET(death_test_use_fork, death_test_use_fork_);
    GTEST_FLAG_SET(filter, filter_);
    GTEST_FLAG_SET(fail_fast, fail_fast_);
    GTEST_FLAG_SET(internal_run_death_test, internal_run_death_test_);
    GTEST_FLAG_SET(list_tests, list_tests_);
    GTEST_FLAG_SET(output, output_);
    GTEST_FLAG_SET(brief, brief_);
    GTEST_FLAG_SET(print_time, print_time_);
    GTEST_FLAG_SET(print_utf8, print_utf8_);
    GTEST_FLAG_SET(random_seed, random_seed_);
    GTEST_FLAG_SET(repeat, repeat_);
    GTEST_FLAG_SET(recreate_environments_when_repeating,
                   recreate_environments_when_repeating_);
    GTEST_FLAG_SET(shuffle, shuffle_);
    GTEST_FLAG_SET(stack_trace_depth, stack_trace_depth_);
    GTEST_FLAG_SET(stream_result_to, stream_result_to_);
    GTEST_FLAG_SET(throw_on_failure, throw_on_failure_);
  }